

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

int __thiscall
SocketInternals::Recv(SocketInternals *this,uchar *bufrecv,size_t maxlen,double timeoutSec)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  double dVar7;
  iovec vec;
  timeval timeout;
  fd_set readfds;
  MsgHeaderType hdr;
  sockaddr_storage addrRemote;
  char controldata [1000];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    readfds.fds_bits[lVar2] = 0;
  }
  iVar1 = this->SocketFD;
  readfds.fds_bits[iVar1 / 0x40] = readfds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  dVar7 = floor(timeoutSec);
  timeout.tv_sec = (__time_t)dVar7;
  timeout.tv_usec = (__suseconds_t)((timeoutSec - (double)timeout.tv_sec) * 1000000.0);
  iVar1 = select(iVar1 + 1,(fd_set *)&readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
  if (iVar1 == -1) {
    pcVar6 = "Recv: select failed: ";
  }
  else {
    if (iVar1 < 1) {
      return iVar1;
    }
    if (this->FirstRun == true) {
      hdr.msg_iov = &vec;
      hdr.msg_name = &addrRemote;
      hdr.msg_namelen = 0x80;
      hdr.msg_iovlen = 1;
      hdr.msg_control = controldata;
      hdr.msg_controllen = 1000;
      vec.iov_base = bufrecv;
      vec.iov_len = maxlen;
      sVar3 = recvmsg(this->SocketFD,(msghdr *)&hdr,0);
      iVar1 = (int)sVar3;
      ExtractInterfaceInfo(this,&hdr);
      poVar4 = std::operator<<(this->outStr,"Using interface ");
      poVar4 = std::operator<<(poVar4,(string *)&this->InterfaceName);
      poVar4 = std::operator<<(poVar4," (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->InterfaceIndex);
      poVar4 = std::operator<<(poVar4,"), MTU: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->InterfaceMTU);
      std::endl<char,std::char_traits<char>>(poVar4);
      this->FirstRun = false;
    }
    else {
      sVar3 = recv(this->SocketFD,bufrecv,maxlen,0);
      iVar1 = (int)sVar3;
    }
    if (iVar1 != -1) {
      return iVar1;
    }
    pcVar6 = "Recv: failed to receive: ";
  }
  poVar4 = std::operator<<(this->outStr,pcVar6);
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  return -1;
}

Assistant:

int SocketInternals::Recv(unsigned char *bufrecv, size_t maxlen, const double timeoutSec)
{
    fd_set readfds;
    FD_ZERO(&readfds);
    FD_SET(SocketFD, &readfds);

#ifdef _MSC_VER
    long sec = static_cast<long>(floor(timeoutSec));
    long usec = static_cast<long>((timeoutSec - sec) * 1e6);
    int nfds = 1;   // On Windows, this parameter to select is ignored
#else
    time_t sec = static_cast<time_t>(floor(timeoutSec));
    suseconds_t usec = static_cast<suseconds_t>((timeoutSec - sec) * 1e6);
    int nfds = SocketFD+1;
#endif
    timeval timeout = { sec , usec };
    int retval = select(nfds, &readfds, NULL, NULL, &timeout);

    // It is o.k. to check against SOCKET_ERROR. On Windows, this is correct.
    // On Linux, we should check for -1 (which is how SOCKET_ERROR is defined above).
    if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
        outStr << "Recv: select failed: " << WSAGetLastError() << std::endl;
#else
        outStr << "Recv: select failed: " << strerror(errno) << std::endl;
#endif
    }
    else if (retval > 0) {

        if (FirstRun) {

            const size_t CONTROL_DATA_SIZE = 1000;  // THIS NEEDS TO BE BIG ENOUGH.
            char controldata[CONTROL_DATA_SIZE];
            MsgHeaderType hdr;

#ifdef _MSC_VER
            SOCKADDR addrRemote;
            GUID WSARecvMsg_GUID = WSAID_WSARECVMSG;
            LPFN_WSARECVMSG WSARecvMsg;
            DWORD nBytes;
            retval = WSAIoctl(SocketFD, SIO_GET_EXTENSION_FUNCTION_POINTER, &WSARecvMsg_GUID,
                              sizeof(WSARecvMsg_GUID), &WSARecvMsg, sizeof(WSARecvMsg), &nBytes,
                              NULL, NULL);
            if (retval == SOCKET_ERROR) {
                outStr << "Recv: could not get WSARecvMsg function pointer" << std::endl;
            }
            else {
                WSABUF WSAbuf;
                WSAbuf.buf = reinterpret_cast<char *>(bufrecv);
                WSAbuf.len = maxlen;

                hdr.name = &addrRemote;
                hdr.namelen = sizeof(addrRemote);
                hdr.lpBuffers = &WSAbuf;
                hdr.dwBufferCount = 1;
                hdr.Control.buf = controldata;
                hdr.Control.len = CONTROL_DATA_SIZE;
                hdr.dwFlags = MSG_PEEK;  // Do not remove message from queue

                retval = WSARecvMsg(SocketFD, &hdr, &nBytes, NULL, NULL);
                if (retval == SOCKET_ERROR)
                    outStr << "Recv: WSARecvMsg failed" << std::endl;
                else
                    ExtractInterfaceInfo(&hdr);
            }
            // For some reason, the call to WSARecvMsg (without MSG_PEEK flag) does
            // not work, so we instead specify MSG_PEEK above and call recv again.
            // This also handles the error case (unable to get WSARecvMsg pointer).
            retval = recv(SocketFD, reinterpret_cast<char *>(bufrecv), maxlen, 0);
#else
            sockaddr_storage addrRemote;

            struct iovec vec;
            vec.iov_base = bufrecv;
            vec.iov_len = maxlen;

            hdr.msg_name = &addrRemote;
            hdr.msg_namelen = sizeof(addrRemote);
            hdr.msg_iov = &vec;
            hdr.msg_iovlen = 1;
            hdr.msg_control = controldata;
            hdr.msg_controllen = CONTROL_DATA_SIZE;

            retval = recvmsg(SocketFD, &hdr, 0);
            ExtractInterfaceInfo(&hdr);
#endif

            outStr << "Using interface " << InterfaceName << " (" << InterfaceIndex << "), MTU: " << InterfaceMTU << std::endl;
            FirstRun = false;
        } else {
            //struct sockaddr_in fromAddr;
            //socklen_t length = sizeof(fromAddr);
            //retval = recvfrom(socketFD, bufrecv, maxlen, 0, reinterpret_cast<struct sockaddr *>(&fromAddr), &length);
            retval = recv(SocketFD, reinterpret_cast<char *>(bufrecv), maxlen, 0);
        }
        if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
            outStr << "Recv: failed to receive: " << WSAGetLastError() << std::endl;
#else
            outStr << "Recv: failed to receive: " << strerror(errno) << std::endl;
#endif
        }
    }
    return retval;
}